

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

void __thiscall VGMPlayer::InitDevices(VGMPlayer *this)

{
  RESMPL_STATE *CAA;
  INT16 *pIVar1;
  QSOUND_WORK *pQVar2;
  byte bVar3;
  pointer pSVar4;
  DEV_GEN_CFG *cfg;
  DEVFUNC_OPTMASK p_Var5;
  DEVFUNC_SETLOGCB p_Var6;
  UINT16 *pUVar7;
  VGM_BASEDEV *pVVar8;
  UINT8 vgmChip;
  UINT8 UVar9;
  UINT16 UVar10;
  UINT32 UVar11;
  long lVar12;
  CHIP_DEVICE *pCVar13;
  char *pcVar14;
  size_t sVar15;
  byte bVar16;
  UINT32 UVar17;
  size_t (*pasVar18) [2];
  code *pcVar19;
  UINT8 UVar20;
  long lVar21;
  ulong uVar22;
  PLR_DEV_OPTS *devOpts;
  VGMPlayer *this_00;
  DEVFUNC_WRITE_A16D16 *pp_Var23;
  DEVFUNC_WRITE_A16D8 *retFuncPtr;
  DEVFUNC_WRITE_BLOCK *retFuncPtr_00;
  SN76496_CFG *snCfg;
  pointer pCVar24;
  pointer pCVar25;
  CHIP_DEVICE local_188;
  char postFix [16];
  string devName;
  
  memset(this->_shownCmdWarnings,0,0x100);
  pCVar25 = (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar25) {
    (this->_devices).
    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar25;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_devNames);
  pasVar18 = this->_vdDevMap;
  for (lVar12 = 0; lVar12 != 0x2a; lVar12 = lVar12 + 1) {
    for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
      (*pasVar18)[lVar21] = 0xffffffffffffffff;
    }
    pasVar18 = pasVar18 + 1;
  }
  for (lVar12 = 0x993; lVar12 != 0x9e7; lVar12 = lVar12 + 1) {
    (&(this->super_PlayerBase)._vptr_PlayerBase)[lVar12] = (_func_int **)0xffffffffffffffff;
  }
  bVar3 = this->_p2612Fix;
  bVar16 = bVar3 & 0x7e;
  if ((char)bVar3 < '\0') {
    bVar16 = bVar3 | 1;
  }
  this->_p2612Fix = bVar16;
  lVar12 = 0;
  uVar22 = 0;
  do {
    pSVar4 = (this->_devCfgs).
             super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_devCfgs).
                       super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0x28) <= uVar22)
    {
      for (uVar22 = 0;
          pCVar25 = (this->_devices).
                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(this->_devices).
                                  super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar25) / 0xf0
                          ); uVar22 = uVar22 + 1) {
        pCVar24 = pCVar25 + uVar22;
        sVar15 = pCVar25[uVar22].optID;
        p_Var6 = (pCVar25[uVar22].base.defInf.devDef)->SetLogCB;
        if (p_Var6 != (DEVFUNC_SETLOGCB)0x0) {
          (*p_Var6)((pCVar24->base).defInf.dataPtr,SndEmuLogCB,&pCVar24->logCbData);
        }
        UVar9 = '\0';
        for (pCVar25 = pCVar24; pCVar25 != (pointer)0x0; pCVar25 = (pointer)(pCVar25->base).linkDev)
        {
          UVar10 = GetChipVolume(this,pCVar24->vgmChipType,pCVar24->chipID,UVar9);
          if (sVar15 == 0xffffffffffffffff) {
            UVar20 = '\0';
          }
          else {
            UVar20 = this->_devOpts[sVar15].resmplMode;
          }
          CAA = &(pCVar25->base).resmpl;
          Resmpl_SetVals(CAA,UVar20,UVar10,(this->super_PlayerBase)._outSmplRate);
          Resmpl_DevConnect(CAA,(DEV_INFO *)pCVar25);
          Resmpl_Init(CAA);
          UVar9 = UVar9 + '\x01';
        }
        if (pCVar24->chipType == '\t') {
          bVar3 = pCVar24->chipID;
          UVar11 = GetChipClock(this,pCVar24->vgmChipType,bVar3);
          if ((int)UVar11 < 0) {
            for (; pCVar24 != (pointer)0x0; pCVar24 = (pointer)(pCVar24->base).linkDev) {
              if ((bVar3 & 1) == 0) {
                pIVar1 = &(pCVar24->base).resmpl.volumeL;
                *pIVar1 = *pIVar1 << 1;
                (pCVar24->base).resmpl.volumeR = 0;
              }
              else {
                (pCVar24->base).resmpl.volumeL = 0;
                pIVar1 = &(pCVar24->base).resmpl.volumeR;
                *pIVar1 = *pIVar1 << 1;
              }
            }
          }
        }
      }
      UVar10 = EstimateOverallVolume(this);
      NormalizeOverallVolume(this,UVar10);
      return;
    }
    bVar3 = (&pSVar4->type)[lVar12];
    bVar16 = (&pSVar4->instance)[lVar12];
    cfg = *(DEV_GEN_CFG **)
           ((long)&(pSVar4->cfgData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
           lVar12);
    memset(&local_188,0,0xf0);
    *(undefined8 *)((long)&pSVar4->deviceID + lVar12) = 0xffffffffffffffff;
    local_188.vgmChipType = (&pSVar4->vgmChipType)[lVar12];
    local_188.chipType = (&pSVar4->type)[lVar12];
    sVar15 = this->_devOptMap[bVar3][bVar16];
    local_188.base.linkDev = (VGM_BASEDEV *)0x0;
    devOpts = this->_devOpts + sVar15;
    if (sVar15 == 0xffffffffffffffff) {
      cfg->emuCore = 0;
      cfg->srMode = '\0';
      UVar11 = 0;
LAB_0011b54d:
      UVar17 = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      UVar11 = devOpts->emuCore[0];
      cfg->emuCore = UVar11;
      cfg->srMode = devOpts->srMode;
      UVar17 = devOpts->smplRate;
      if (UVar17 == 0) goto LAB_0011b54d;
    }
    cfg->smplRate = UVar17;
    UVar17 = local_188.flags;
    local_188.chipID = bVar16;
    local_188.optID = sVar15;
    local_188.cfgID = uVar22;
    switch(bVar3) {
    case 0x1f:
      local_188.flags = 0;
      UVar11 = GetChipClock(this,local_188.vgmChipType,bVar16);
      local_188.flags = (UINT32)((UVar11 & 0x3fffffff) < cfg->clock);
      if (cfg->emuCore == 0) {
        cfg->emuCore = 0x43545200;
      }
      UVar9 = SndEmu_Start('\x1f',cfg,(DEV_INFO *)&local_188);
      if (UVar9 != '\0') break;
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x02','\x12',0,&local_188.writeD16);
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0,&local_188.romSize);
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x80,0,&local_188.romWrite);
      pQVar2 = this->_qsWork + bVar16;
      pQVar2->write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
      pQVar2->startAddrCache[0] = 0;
      pQVar2->startAddrCache[1] = 0;
      pQVar2->startAddrCache[2] = 0;
      pQVar2->startAddrCache[3] = 0;
      pUVar7 = this->_qsWork[bVar16].startAddrCache;
      pUVar7[4] = 0;
      pUVar7[5] = 0;
      pUVar7[6] = 0;
      pUVar7[7] = 0;
      pUVar7[8] = 0;
      pUVar7[9] = 0;
      pUVar7[10] = 0;
      pUVar7[0xb] = 0;
      pUVar7 = this->_qsWork[bVar16].startAddrCache;
      pUVar7[0xc] = 0;
      pUVar7[0xd] = 0;
      pUVar7[0xe] = 0;
      pUVar7[0xf] = 0;
      pUVar7[0x10] = 0;
      pUVar7[0x11] = 0;
      pUVar7[0x12] = 0;
      pUVar7[0x13] = 0;
      pQVar2 = this->_qsWork + bVar16;
      pQVar2->pitchCache[0xc] = 0;
      pQVar2->pitchCache[0xd] = 0;
      pQVar2->pitchCache[0xe] = 0;
      pQVar2->pitchCache[0xf] = 0;
      pUVar7 = this->_qsWork[bVar16].pitchCache;
      pUVar7[4] = 0;
      pUVar7[5] = 0;
      pUVar7[6] = 0;
      pUVar7[7] = 0;
      pUVar7[8] = 0;
      pUVar7[9] = 0;
      pUVar7[10] = 0;
      pUVar7[0xb] = 0;
      if ((local_188.base.defInf.devDef)->coreID == 0x4d414d45) {
        local_188.flags = local_188.flags & 0xfffffffe;
      }
      if (local_188.writeD16 == (DEVFUNC_WRITE_A8D16)0x0) {
        if (local_188.write8 != (DEVFUNC_WRITE_A8D8)0x0) {
          pcVar19 = WriteQSound_B;
          goto LAB_0011bda8;
        }
        this->_qsWork[bVar16].write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
      }
      else {
        pcVar19 = WriteQSound_A;
LAB_0011bda8:
        this->_qsWork[bVar16].write = pcVar19;
      }
      goto LAB_0011bb3e;
    case 0x20:
      UVar9 = SndEmu_Start(' ',cfg,(DEV_INFO *)&local_188);
      if (UVar9 != '\0') break;
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','!',0,&local_188.writeM8);
      UVar9 = '\"';
      pp_Var23 = &local_188.writeM16;
LAB_0011b845:
      SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0',UVar9,0,pp_Var23);
      goto LAB_0011bb21;
    case 0x21:
      UVar9 = SndEmu_Start('!',cfg,(DEV_INFO *)&local_188);
      if (UVar9 == '\0') {
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
        UVar9 = '\x10';
        UVar20 = '!';
        UVar10 = 0;
        retFuncPtr_00 = (DEVFUNC_WRITE_BLOCK *)&local_188.writeM8;
        goto LAB_0011bb30;
      }
      break;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x26:
      goto switchD_0011b6ea_caseD_1;
    case 0x25:
      UVar9 = SndEmu_Start('%',cfg,(DEV_INFO *)&local_188);
      if (UVar9 == '\0') {
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
        UVar9 = '\x12';
        pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeD16;
        goto LAB_0011b845;
      }
      break;
    case 0x27:
      UVar9 = SndEmu_Start('\'',cfg,(DEV_INFO *)&local_188);
      if (UVar9 != '\0') break;
      UVar9 = '\"';
      pp_Var23 = &local_188.writeM16;
      goto LAB_0011baf7;
    default:
      switch(bVar3) {
      case 0:
        if ((((bVar16 & 1) != 0) && (cfg->flags != '\0')) &&
           (pCVar13 = GetDevicePtr(this,local_188.vgmChipType,bVar16 & 0xfe),
           pCVar13 != (CHIP_DEVICE *)0x0)) {
          *(DEV_DATA **)&cfg[1].clock = (pCVar13->base).defInf.dataPtr;
          UVar11 = ((pCVar13->base).defInf.devDef)->coreID;
          cfg->emuCore = UVar11;
        }
        if (UVar11 == 0) {
          cfg->emuCore = 0x4d414d45;
        }
        UVar9 = SndEmu_Start('\0',cfg,(DEV_INFO *)&local_188);
        if (UVar9 != '\0') break;
        UVar9 = '\0';
        UVar20 = '\x11';
        UVar10 = 0;
        retFuncPtr_00 = (DEVFUNC_WRITE_BLOCK *)&local_188.write8;
        goto LAB_0011bb30;
      case 2:
        UVar17 = (uint)cfg->flags;
      case 1:
      case 3:
      case 4:
      case 6:
      case 7:
switchD_0011b6ea_caseD_1:
        local_188.flags = UVar17;
        UVar9 = SndEmu_Start(bVar3,cfg,(DEV_INFO *)&local_188);
        if (UVar9 == '\0') {
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
          UVar9 = '!';
          pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeM8;
LAB_0011baf7:
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0',UVar9,0,pp_Var23);
          UVar9 = 0x81;
          retFuncPtr = (DEVFUNC_WRITE_A16D8 *)&local_188.romSize;
LAB_0011bb15:
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',UVar9,0,retFuncPtr);
LAB_0011bb21:
          UVar9 = '\x10';
          UVar20 = 0x80;
          UVar10 = 0;
          retFuncPtr_00 = &local_188.romWrite;
LAB_0011bb30:
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,UVar9,UVar20,UVar10,retFuncPtr_00);
LAB_0011bb3e:
          *(long *)((long)&pSVar4->deviceID + lVar12) =
               ((long)(this->_devices).
                      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_devices).
                     super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xf0;
          pcVar14 = SndEmu_GetDevName(bVar3,'\0',cfg);
          std::__cxx11::string::string((string *)&devName,pcVar14,(allocator *)postFix);
          UVar11 = GetChipCount(this,(&pSVar4->vgmChipType)[lVar12]);
          if (1 < UVar11) {
            snprintf(postFix,0x10," #%u",(ulong)(bVar16 + 1));
            std::__cxx11::string::append((char *)&devName);
          }
          local_188.logCbData.chipDevID =
               ((long)(this->_devices).
                      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_devices).
                     super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xf0;
          local_188.logCbData.player = this;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_devNames,&devName);
          postFix._8_8_ = (long)&pSVar4->deviceID + lVar12;
          postFix._0_8_ = this;
          if ((local_188.base.defInf.devDef)->SetLogCB != (DEVFUNC_SETLOGCB)0x0) {
            (*(local_188.base.defInf.devDef)->SetLogCB)
                      (local_188.base.defInf.dataPtr,SndEmuLogCB,&local_188.logCbData);
          }
          SetupLinkedDevices(&local_188.base,DeviceLinkCallback,postFix);
          if (sVar15 != 0xffffffffffffffff) {
            this_00 = this;
            RefreshDevOptions(this,&local_188,devOpts);
            RefreshMuting(this_00,&local_188,&devOpts->muteOpts);
            RefreshPanning(this_00,&local_188,&devOpts->panOpts);
          }
          pVVar8 = local_188.base.linkDev;
          if (((local_188.base.defInf.linkDevCount != 0) &&
              ((local_188.base.defInf.linkDevs)->devID == '\x12')) &&
             ((sVar15 = DeviceID2OptionID(this,(uint)bVar16 << 0x10 | 0x80000012),
              pVVar8 != (VGM_BASEDEV *)0x0 && sVar15 != 0xffffffffffffffff &&
              (p_Var5 = ((pVVar8->defInf).devDef)->SetOptionBits, p_Var5 != (DEVFUNC_OPTMASK)0x0))))
          {
            (*p_Var5)(local_188.base.defInf.dataPtr,this->_devOpts[sVar15].coreOpts);
          }
          sVar15 = ((long)(this->_devices).
                          super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_devices).
                         super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xf0;
          this->_vdDevMap[(&pSVar4->vgmChipType)[lVar12]][bVar16] = sVar15;
          if (local_188.optID != 0xffffffffffffffff) {
            this->_optDevMap[local_188.optID] = sVar15;
          }
          std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::push_back
                    (&this->_devices,&local_188);
          std::__cxx11::string::~string((string *)&devName);
        }
        break;
      case 5:
        if (UVar11 == 0) {
          UVar11 = 0x4d414d45;
          if (cfg->flags == '\x01') {
            UVar11 = 0x47454e53;
          }
          cfg->emuCore = UVar11;
        }
        UVar9 = SndEmu_Start('\x05',cfg,(DEV_INFO *)&local_188);
        if (UVar9 != '\0') break;
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
        UVar9 = '!';
        retFuncPtr = &local_188.writeM8;
        goto LAB_0011bb15;
      case 8:
        UVar9 = SndEmu_Start('\b',cfg,(DEV_INFO *)&local_188);
        if (UVar9 == '\0') {
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x41,&local_188.romSize);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x80,0x41,&local_188.romWrite);
          UVar9 = '\x10';
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x42,&local_188.romSizeB);
          UVar20 = 0x80;
          UVar10 = 0x42;
          retFuncPtr_00 = &local_188.romWriteB;
          goto LAB_0011bb30;
        }
        break;
      default:
        if (bVar3 == 0xd) {
          UVar9 = SndEmu_Start('\r',cfg,(DEV_INFO *)&local_188);
          if (UVar9 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x524f,&local_188.romSize)
            ;
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x80,0x524f,&local_188.romWrite);
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x81,0x5241,&local_188.romSizeB);
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x80,0x5241,&local_188.romWriteB);
            LoadOPL4ROM(this,&local_188);
            goto LAB_0011bb3e;
          }
        }
        else if (bVar3 == 0x11) {
          UVar9 = SndEmu_Start('\x11',cfg,(DEV_INFO *)&local_188);
          if (UVar9 == '\0') {
            UVar9 = '\0';
            UVar20 = '\x12';
            UVar10 = 0;
            retFuncPtr_00 = (DEVFUNC_WRITE_BLOCK *)&local_188.writeD16;
            goto LAB_0011bb30;
          }
        }
        else {
          if (bVar3 != 0x15) {
            UVar17 = 1;
            if (bVar3 != 0x80) {
              UVar17 = local_188.flags;
            }
            goto switchD_0011b6ea_caseD_1;
          }
          UVar9 = SndEmu_Start('\x15',cfg,(DEV_INFO *)&local_188);
          if (UVar9 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            UVar9 = '\x12';
            pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeD16;
            goto LAB_0011baf7;
          }
        }
      }
    }
    uVar22 = uVar22 + 1;
    lVar12 = lVar12 + 0x28;
  } while( true );
}

Assistant:

void VGMPlayer::InitDevices(void)
{
	size_t curChip;
	
	memset(_shownCmdWarnings, 0, 0x100);
	
	_devices.clear();
	_devNames.clear();
	{
		UINT8 vgmChip;
		UINT8 chipID;
		for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		{
			for (chipID = 0; chipID < 2; chipID ++)
				_vdDevMap[vgmChip][chipID] = (size_t)-1;
		}
	}
	for (curChip = 0; curChip < _OPT_DEV_COUNT * 2; curChip ++)
		_optDevMap[curChip] = (size_t)-1;
	
	// When the Project2612 fix is enabled [bit 7], enable it during chip init [bit 0].
	if (_p2612Fix & P2612FIX_ENABLE)
		_p2612Fix |= P2612FIX_ACTIVE;
	else
		_p2612Fix &= ~P2612FIX_ACTIVE;
	
	for (curChip = 0; curChip < _devCfgs.size(); curChip ++)
	{
		SONG_DEV_CFG& sdCfg = _devCfgs[curChip];
		UINT8 chipType = sdCfg.type;
		UINT8 chipID = sdCfg.instance;
		DEV_GEN_CFG* devCfg = (DEV_GEN_CFG*)&sdCfg.cfgData[0];
		CHIP_DEVICE chipDev;
		DEV_INFO* devInf;
		const PLR_DEV_OPTS* devOpts;
		UINT8 retVal;
		
		memset(&chipDev, 0x00, sizeof(CHIP_DEVICE));
		devInf = &chipDev.base.defInf;
		
		sdCfg.deviceID = (size_t)-1;
		chipDev.vgmChipType = sdCfg.vgmChipType;
		chipDev.chipType = sdCfg.type;
		chipDev.chipID = chipID;
		chipDev.optID = _devOptMap[chipType][chipID];
		chipDev.cfgID = curChip;
		chipDev.base.defInf.dataPtr = NULL;
		chipDev.base.linkDev = NULL;
		
		devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		switch(chipType)
		{
		case DEVID_SN76496:
			if ((chipID & 0x01) && devCfg->flags)	// must be 2nd chip + T6W28 mode
			{
				CHIP_DEVICE* otherDev = GetDevicePtr(sdCfg.vgmChipType, chipID ^ 0x01);
				if (otherDev != NULL)
				{
					SN76496_CFG* snCfg = (SN76496_CFG*)devCfg;
					// set pointer to other instance, for connecting both
					snCfg->t6w28_tone = otherDev->base.defInf.dataPtr;
					// ensure that both instances use the same core, as they are going to cross-reference each other
					snCfg->_genCfg.emuCore = otherDev->base.defInf.devDef->coreID;
				}
			}
			
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_MAME;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			break;
		case DEVID_RF5C68:
			if (! devCfg->emuCore)
			{
				if (devCfg->flags == 1)	// RF5C164
					devCfg->emuCore = FCC_GENS;
				else //if (devCfg->flags == 0)	// RF5C68
					devCfg->emuCore = FCC_MAME;
			}
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_YM2610:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'A', (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'A', (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'B', (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'B', (void**)&chipDev.romWriteB);
			break;
		case DEVID_YMF278B:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x524F, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x524F, (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x5241, (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x5241, (void**)&chipDev.romWriteB);
			LoadOPL4ROM(&chipDev);
			break;
		case DEVID_32X_PWM:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			break;
		case DEVID_YMW258:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_C352:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_QSOUND:
			chipDev.flags = 0x00;
			{
				UINT32 hdrClock = GetChipClock(sdCfg.vgmChipType, chipID) & ~0xC0000000;
				if (hdrClock < devCfg->clock)	// QSound VGMs with old (4 MHz) clock
					chipDev.flags |= 0x01;	// enable QSound hacks (required for proper playback of old VGMs)
			}
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_CTR_;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_QUICKWRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			
			memset(&_qsWork[chipID], 0x00, sizeof(QSOUND_WORK));
			if (devInf->devDef->coreID == FCC_MAME)
				chipDev.flags &= ~0x01;	// MAME's old HLE doesn't need those hacks
			if (chipDev.writeD16 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_A;
			else if (chipDev.write8 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_B;
			else
				_qsWork[chipID].write = NULL;
			break;
		case DEVID_WSWAN:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			break;
		case DEVID_ES5506:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_SCSP:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		default:
			if (chipType == DEVID_YM2612)
				chipDev.flags |= devCfg->flags;
			else if (chipType == DEVID_C219)
				chipDev.flags |= 0x01;	// enable 16-bit byteswap patch on all ROM data
			
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		}
		if (retVal)
		{
			devInf->dataPtr = NULL;
			devInf->devDef = NULL;
			continue;
		}
		sdCfg.deviceID = _devices.size();
		
		std::string devName = SndEmu_GetDevName(chipType, 0x00, devCfg);	// use short name for now
		if (GetChipCount(sdCfg.vgmChipType) > 1)
		{
			char postFix[0x10];
			snprintf(postFix, 0x10, " #%u", 1 + chipID);
			devName += postFix;
		}
		chipDev.logCbData.player = this;
		chipDev.logCbData.chipDevID = _devices.size();
		_devNames.push_back(devName);	// push here, so that we can have logs during SetupLinkedDevices()
		
		{
			DEVLINK_CB_DATA dlCbData;
			dlCbData.player = this;
			dlCbData.sdCfg = &sdCfg;
			dlCbData.chipDev = &chipDev;
			if (devInf->devDef->SetLogCB != NULL)	// allow for device link warnings
				devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
			SetupLinkedDevices(&chipDev.base, &DeviceLinkCallback, &dlCbData);
		}
		// already done by SndEmu_Start()
		//devInf->devDef->Reset(devInf->dataPtr);
		
		if (devOpts != NULL)
		{
			RefreshDevOptions(chipDev, *devOpts);
			RefreshMuting(chipDev, devOpts->muteOpts);
			RefreshPanning(chipDev, devOpts->panOpts);
		}
		if (devInf->linkDevCount > 0 && devInf->linkDevs[0].devID == DEVID_AY8910)
		{
			VGM_BASEDEV* clDev = chipDev.base.linkDev;
			size_t optID = DeviceID2OptionID(PLR_DEV_ID(DEVID_AY8910, chipID));
			if (optID != (size_t)-1 && clDev != NULL && clDev->defInf.devDef->SetOptionBits != NULL)
				clDev->defInf.devDef->SetOptionBits(devInf->dataPtr, _devOpts[optID].coreOpts);
		}

		_vdDevMap[sdCfg.vgmChipType][chipID] = _devices.size();
		if (chipDev.optID != (size_t)-1)
			_optDevMap[chipDev.optID] = _devices.size();
		_devices.push_back(chipDev);
	}	// end for (curChip)
	
	// Initializing the resampler has to be done separately due to reallocations happening above
	// and the memory address of the RESMPL_STATE mustn't change in order to allow callbacks from the devices.
	for (curChip = 0; curChip < _devices.size(); curChip ++)
	{
		CHIP_DEVICE& chipDev = _devices[curChip];
		DEV_INFO* devInf = &chipDev.base.defInf;
		const PLR_DEV_OPTS* devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		VGM_BASEDEV* clDev;
		
		if (devInf->devDef->SetLogCB != NULL)
			devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
		
		UINT8 linkCntr = 0;
		for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
		{
			UINT16 chipVol = GetChipVolume(chipDev.vgmChipType, chipDev.chipID, linkCntr);
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, chipVol, _outSmplRate);
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
		
		if (chipDev.chipType == DEVID_YM3812)
		{
			if (GetChipClock(chipDev.vgmChipType, chipDev.chipID) & 0x80000000)
			{
				// Dual-OPL with Stereo - 1st chip is panned to the left, 2nd chip is panned to the right
				for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
				{
					if (chipDev.chipID & 0x01)
					{
						clDev->resmpl.volumeL = 0x00;
						clDev->resmpl.volumeR *= 2;
					}
					else
					{
						clDev->resmpl.volumeL *= 2;
						clDev->resmpl.volumeR = 0x00;
					}
				}
			}
		}
	}
	
	NormalizeOverallVolume(EstimateOverallVolume());
	
	return;
}